

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void render_obj(gba_ppu_t *ppu)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  short sVar18;
  int iVar19;
  ulong uVar20;
  int sprite_x;
  int iVar21;
  uint uVar22;
  uint uVar23;
  short sVar24;
  ushort uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  short sVar30;
  short sVar31;
  int iVar32;
  ushort uVar33;
  ushort uVar34;
  bool bVar35;
  uint uVar36;
  uint uVar37;
  int local_9c;
  short local_5c;
  
  lVar16 = 0x26162;
  do {
    *(undefined1 *)((long)(ppu->screen + -1) + 0x3be + lVar16) = 0;
    (&ppu->screen[0][0x77].g)[lVar16] = '\0';
    *(ushort *)((long)ppu + lVar16 * 2 + -0x26342) = *(ushort *)ppu->pram | 0x8000;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x26252);
  uVar2 = ppu->y;
  uVar13 = (uint)uVar2;
  lVar16 = 0;
  do {
    uVar3 = *(ushort *)(ppu->oam + lVar16 * 8);
    uVar4 = *(ushort *)(ppu->oam + lVar16 * 8 + 2);
    uVar20 = (ulong)(uVar3 >> 10 & 0xfffffff0);
    iVar7 = *(int *)((long)sprite_heights[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar20);
    iVar26 = iVar7 / 2;
    uVar33 = uVar3 >> 8 & 3;
    uVar14 = uVar3 & 0xff;
    iVar15 = 0;
    if (uVar33 == 3) {
      iVar15 = iVar26;
    }
    iVar8 = iVar15 + uVar14;
    iVar15 = iVar15 + -0x100 + uVar14;
    if (iVar8 < 0xa0) {
      iVar15 = iVar8;
    }
    uVar23 = uVar13 - iVar15;
    uVar14 = ~uVar23 + iVar7;
    if ((uVar4 >> 0xd & 1) == 0) {
      uVar14 = uVar23;
    }
    if (uVar33 == 1) {
      uVar14 = uVar23;
    }
    if (uVar33 == 3) {
      uVar14 = uVar23;
    }
    iVar8 = *(int *)((long)sprite_widths[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar20);
    iVar29 = iVar8 / 2;
    iVar32 = 0;
    if (uVar33 == 3) {
      iVar32 = iVar29;
    }
    iVar19 = iVar8 + 7;
    if (-1 < iVar8) {
      iVar19 = iVar8;
    }
    iVar27 = iVar32 + (uVar4 & 0x1ff);
    iVar10 = iVar32 + -0x200 + (uVar4 & 0x1ff);
    if (iVar27 < 0xf0) {
      iVar10 = iVar27;
    }
    iVar21 = iVar15 + iVar7;
    iVar27 = iVar8 + iVar10;
    local_9c = iVar10;
    if ((uVar33 | 2) == 3) {
      uVar20 = (ulong)(uVar4 >> 4 & 0x3e0);
      sVar18 = *(short *)(ppu->oam + uVar20 + 6);
      sVar31 = *(short *)(ppu->oam + uVar20 + 0xe);
      sVar24 = *(short *)(ppu->oam + uVar20 + 0x16);
      sVar30 = *(short *)(ppu->oam + uVar20 + 0x1e);
      if (uVar33 == 3) {
        iVar15 = iVar15 - iVar26;
        iVar21 = iVar21 + iVar26;
        local_9c = iVar10 + iVar29 * -2;
        if (local_9c < 1) {
          local_9c = 0;
        }
        iVar27 = iVar27 + iVar29 * 2;
        if (iVar27 < 0xf1) {
          iVar27 = 0xf0;
        }
      }
    }
    else {
      sVar18 = 0xff;
      sVar31 = 0;
      sVar24 = 0;
      sVar30 = 0xff;
    }
    if (((uVar33 != 2) && (iVar15 <= (int)uVar13)) && ((int)uVar13 < iVar21)) {
      uVar23 = -iVar29;
      if (uVar33 != 3) {
        uVar23 = 0;
      }
      if ((int)uVar23 < iVar32 + iVar8) {
        uVar5 = *(ushort *)(ppu->oam + lVar16 * 8 + 4);
        uVar36 = uVar3 & 0x2000;
        uVar34 = uVar3 >> 10 & 3;
        iVar21 = (uVar23 - iVar29) * (int)sVar24 + (int)sVar30 * (uVar14 - iVar26);
        iVar15 = (uVar23 - iVar29) * (int)sVar18 + (int)sVar31 * (uVar14 - iVar26);
        do {
          if ((uVar33 | 2) == 3) {
            uVar28 = (iVar15 >> 8) + iVar29;
            if (((int)uVar28 < iVar8 && -1 < (int)uVar28) &&
               (uVar22 = (iVar21 >> 8) + iVar26, (int)uVar22 < iVar7 && -1 < (int)uVar22))
            goto LAB_001177cb;
          }
          else {
            uVar28 = uVar23;
            uVar22 = uVar14;
            if ((uVar4 >> 0xc & 1) != 0) {
              uVar28 = ~uVar23 + iVar8;
            }
LAB_001177cb:
            uVar37 = uVar22 + 7;
            if (-1 < (int)uVar22) {
              uVar37 = uVar22;
            }
            uVar6 = (ppu->DISPCNT).raw;
            iVar9 = ((int)uVar37 >> 3) << 5;
            if ((uVar6 & 0x40) != 0) {
              iVar9 = (((int)uVar37 >> 3) << ((byte)(uVar3 >> 0xd) & 1)) * (iVar19 >> 3);
            }
            uVar37 = iVar10 + uVar23;
            if (((uVar37 < 0xf0) && (local_9c <= (int)uVar37)) &&
               (((int)uVar37 < iVar27 &&
                (((short)ppu->objbuf[uVar37].raw < 0 ||
                 ((uVar5 >> 10 & 3) < (ushort)ppu->obj_priorities[uVar37])))))) {
              uVar11 = uVar28 + 7;
              if (-1 < (int)uVar28) {
                uVar11 = uVar28;
              }
              iVar1 = (int)uVar28 % 8 + ((int)uVar22 % 8) * 8;
              uVar28 = (uint)ppu->vram[(iVar1 >> ((uVar3 & 0x2000) == 0)) +
                                       ((((int)uVar11 >> 3) << (sbyte)(uVar36 >> 0xd)) +
                                        (uVar5 & 0x3ff) + iVar9) * 0x20 + 0x10000];
              local_5c = (short)uVar36;
              if (local_5c == 0) {
                bVar12 = ppu->vram[(iVar1 >> ((uVar3 & 0x2000) == 0)) +
                                   ((((int)uVar11 >> 3) << (sbyte)(uVar36 >> 0xd)) + (uVar5 & 0x3ff)
                                   + iVar9) * 0x20 + 0x10000] >>
                         (((char)iVar1 - ((char)iVar1 - (char)(iVar1 >> 0x1f) & 0x3eU)) * '\x04' &
                         0x1f);
                if ((bVar12 & 0xf) != 0) {
                  uVar28 = (uVar5 >> 7 & 0xffffffe0) + (bVar12 & 0xf) * 2 >> 1;
                  goto LAB_001178f0;
                }
              }
              else if (uVar28 != 0) {
LAB_001178f0:
                if (uVar34 == 2) {
                  ppu->obj_window[uVar37] = true;
                }
                else {
                  if ((byte)(ppu->WIN0H).raw < uVar37 || uVar37 < (ppu->WIN0H).raw >> 8) {
                    bVar17 = false;
                  }
                  else {
                    bVar17 = uVar2 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar2;
                  }
                  if ((byte)(ppu->WIN1H).raw < uVar37 || uVar37 < (ppu->WIN1H).raw >> 8) {
                    bVar35 = false;
                  }
                  else {
                    bVar35 = uVar2 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar2;
                  }
                  uVar25 = (ppu->WININ).raw;
                  bVar12 = (byte)(uVar6 >> 8);
                  if ((bVar12 >> 5 & 1 & bVar17) == 0) {
                    if (((bVar12 >> 6 & 1 & bVar35) != 0) ||
                       ((uVar25 = (ppu->WINOUT).raw, (short)uVar6 < 0 &&
                        (ppu->obj_window[uVar37] != false)))) {
                      uVar25 = uVar25 & 0x1000;
                      goto LAB_001179ec;
                    }
                    if (((bVar17 == false && bVar35 == false) && ((byte)uVar25 >> 4 & 1) == 0) &&
                        (uVar6 & 0x6000) != 0) goto LAB_00117a2d;
                  }
                  else {
                    uVar25 = uVar25 & 0x10;
LAB_001179ec:
                    if (uVar25 == 0) goto LAB_00117a2d;
                  }
                  ppu->obj_priorities[uVar37] = (byte)(uVar5 >> 10) & 3;
                  ppu->obj_alpha[uVar37] = uVar34 == 1;
                  ppu->objbuf[uVar37].raw =
                       *(ushort *)(ppu->pram + (ulong)uVar28 * 2 + 0x200) & 0x7fff;
                }
              }
            }
          }
LAB_00117a2d:
          uVar23 = uVar23 + 1;
          iVar21 = iVar21 + sVar24;
          iVar15 = iVar15 + sVar18;
        } while (iVar32 + iVar8 != uVar23);
      }
    }
    lVar16 = lVar16 + 1;
    if (lVar16 == 0x80) {
      return;
    }
  } while( true );
}

Assistant:

void render_obj(gba_ppu_t* ppu) {
    obj_attr0_t attr0;
    obj_attr1_t attr1;
    obj_attr2_t attr2;

    clear_obj(ppu);

    for (int sprite = 0; sprite < 128; sprite++) {
        attr0.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 0);
        attr1.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 2);
        attr2.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 4);

        int height = sprite_heights[attr0.shape][attr1.size];
        int width = sprite_widths[attr0.shape][attr1.size];
        int tiles_wide = width / 8;

        int hheight = height / 2;
        int hwidth = width / 2;

        bool is_double_affine = attr0.affine_object_mode == OBJ_AFF_MODE_DOUBLE;
        bool is_affine = attr0.affine_object_mode == OBJ_AFF_MODE_AFFINE || is_double_affine;

        int adjusted_x = attr1.x;
        int adjusted_y = attr0.y;

        if (is_double_affine) {
            adjusted_x += hwidth;
            adjusted_y += hheight;
        }

        if (adjusted_x >= 240) {
            adjusted_x -= 512;
        }
        if (adjusted_y >= 160) {
            adjusted_y -= 256;
        }

        int sprite_y = ppu->y - adjusted_y;
        if (!is_affine && attr1.vflip) {
            sprite_y = height - sprite_y - 1;
        }

        int screen_min_y = adjusted_y;
        int screen_max_y = adjusted_y + height;

        int screen_min_x = adjusted_x;
        int screen_max_x = adjusted_x + width;


        obj_affine_t affine;
        if (is_affine) {
            affine.pa = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 6);
            affine.pb = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 14);
            affine.pc = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 22);
            affine.pd = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 30);
            if (is_double_affine) { // double rendering area
                screen_min_y -= hheight;
                screen_max_y += hheight;

                screen_min_x -= hwidth;
                screen_max_x += hwidth;

                screen_min_x -= (width / 2);
                if (screen_min_x < 0) {
                    screen_min_x = 0;
                }
                screen_max_x += (width / 2);
                if (screen_max_x < GBA_SCREEN_X) {
                    screen_max_x = GBA_SCREEN_X;
                }
            }

        } else {
            // Set to identity matrix
            affine.pa = 0xFF;
            affine.pb = 0x00;
            affine.pc = 0x00;
            affine.pd = 0xFF;
        }

        if (ppu->y >= screen_min_y && ppu->y < screen_max_y) { // If the sprite is visible, we should draw it.
            if (attr0.affine_object_mode != OBJ_AFF_MODE_HIDE) { // Not disabled
                int sprite_x_start = is_double_affine ? -hwidth : 0;
                int sprite_x_end   = is_double_affine ? width + hwidth : width;
                for (int sprite_x = sprite_x_start; sprite_x < sprite_x_end; sprite_x++) {
                    int adjusted_sprite_x = sprite_x;
                    int adjusted_sprite_y = sprite_y;

                    if (is_affine) {
                        adjusted_sprite_x = affine.pa * (sprite_x - hwidth) + affine.pb * (sprite_y - hheight);
                        adjusted_sprite_x >>= 8;
                        adjusted_sprite_x += hwidth;

                        if (adjusted_sprite_x >= width || adjusted_sprite_x < 0) {
                            continue;
                        }

                        adjusted_sprite_y = affine.pc * (sprite_x - hwidth) + affine.pd * (sprite_y - hheight);
                        adjusted_sprite_y >>= 8;
                        adjusted_sprite_y += hheight;

                        if (adjusted_sprite_y >= height || adjusted_sprite_y < 0) {
                            continue;
                        }

                    } else if (attr1.hflip) {
                        adjusted_sprite_x = width - sprite_x - 1;
                    }

                    int y_tid_offset;
                    int sprite_tile_y = adjusted_sprite_y / 8;
                    if (ppu->DISPCNT.obj_character_vram_mapping) { // 1D
                        // Tiles are twice as wide in 256 color mode
                        y_tid_offset = tiles_wide * (sprite_tile_y << attr0.is_256color);
                    } else { // 2D
                        y_tid_offset = 32 * sprite_tile_y;
                    }
                    // After adding this offset, we won't need to worry about 1D vs 2D,
                    // because in either case they'll be right next to each other in memory.
                    int tid = attr2.tid + y_tid_offset;

                    // Don't use the adjusted X or Y here. There'd be no point in transforming the sprite, otherwise.
                    int screen_x = sprite_x + adjusted_x;
                    // Only draw if we've never drawn anything there before. Lower indices have higher priority
                    // and that's the order we're drawing them here.
                    if (screen_x < GBA_SCREEN_X && screen_x >= 0 && screen_x >= screen_min_x && screen_x < screen_max_x && (ppu->objbuf[screen_x].transparent || attr2.priority < ppu->obj_priorities[screen_x])) {
                        // Tiles are twice as wide in 256 color mode
                        int x_tid_offset = (adjusted_sprite_x / 8) << attr0.is_256color;
                        int tid_offset_by_x = tid + x_tid_offset;
                        word tile_address = 0x10000 + tid_offset_by_x * OBJ_TILE_SIZE;

                        int in_tile_x = adjusted_sprite_x % 8;
                        int in_tile_y = adjusted_sprite_y % 8;

                        int in_tile_offset = in_tile_x + in_tile_y * 8;
                        tile_address += in_tile_offset >> (!attr0.is_256color);

                        byte tile = ppu->vram[tile_address];
                        if (!attr0.is_256color) {
                            tile >>= (in_tile_offset % 2) * 4;
                            tile &= 0xF;
                        }

                        if (tile != 0) {

                            word palette_address = 0x200; // OBJ palette base
                            if (attr0.is_256color) {
                                palette_address += 2 * tile;
                            } else {
                                palette_address += (0x20 * attr2.pb + 2 * tile);
                            }
                            if (attr0.graphics_mode == OBJ_MODE_OBJWIN) {
                                ppu->obj_window[screen_x] = true;
                            } else {
                                if (should_render_pixel_window(ppu, screen_x, ppu->y, ppu->WININ.win0_obj_enable, ppu->WININ.win1_obj_enable, ppu->WINOUT.outside_obj_enable, ppu->WINOUT.obj_obj_enable)) {
                                    ppu->obj_priorities[screen_x] = attr2.priority;
                                    ppu->obj_alpha[screen_x] = attr0.graphics_mode == OBJ_MODE_ALPHA;
                                    ppu->objbuf[screen_x].raw = half_from_byte_array(ppu->pram, palette_address);
                                    ppu->objbuf[screen_x].transparent = false;
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}